

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void ImportModuleFunctions(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  long *plVar1;
  uchar uVar2;
  byte bVar3;
  uint uVar4;
  ModuleData *pMVar5;
  Allocator *pAVar6;
  Lexeme *pLVar7;
  FunctionData *function;
  char *pcVar8;
  char *pcVar9;
  IntrusiveList<MatchData> generics_00;
  InplaceStr name;
  InplaceStr name_00;
  IntrusiveList<TypeHandle> arguments;
  long lVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint offset;
  ExternFuncInfo *pEVar15;
  size_t sVar16;
  undefined4 extraout_var;
  TypeBase *pTVar17;
  undefined4 extraout_var_00;
  NamespaceData **ppNVar18;
  TypeRef *pTVar19;
  ModuleData **ppMVar20;
  SynBase *source_00;
  SynIdentifier *this;
  undefined4 extraout_var_03;
  FunctionData *pFVar21;
  ScopeData *this_00;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TypeHandle *node_00;
  TypeBase *pTVar22;
  ArgumentData *pAVar23;
  FunctionData **ppFVar24;
  undefined4 extraout_var_12;
  ExprBase *pEVar25;
  undefined4 extraout_var_14;
  TypeFunction *pTVar26;
  uint k;
  uint uVar27;
  char *pcVar28;
  uint n_1;
  uint *puVar29;
  ModuleContext *moduleCtx_00;
  ulong uVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  ExternFuncInfo *pEVar34;
  ByteCode *pBVar35;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  InplaceStr name_04;
  FunctionData *data;
  uchar local_15b;
  uchar local_15a;
  char local_159;
  TypeBase *local_158;
  char *local_150;
  ModuleData **local_148;
  ModuleContext *local_140;
  undefined4 local_134;
  TypeRef *local_130;
  ExternLocalInfo *local_128;
  ExternVarInfo *local_120;
  ExternFuncInfo *local_118;
  TypeFunction *local_110;
  ByteCode *local_108;
  SmallArray<FunctionData_*,_128U> *local_100;
  undefined8 local_f8;
  FunctionData *prev;
  InplaceStr functionName;
  FunctionLookupChain chain;
  FunctionLookupChain local_90;
  IntrusiveList<MatchData> generics;
  InplaceStr local_60;
  TraceScope traceScope;
  InplaceStr defaultAssignName;
  MatchData *node;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_11;
  undefined4 extraout_var_13;
  
  local_140 = moduleCtx;
  if ((ImportModuleFunctions(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') &&
     (iVar12 = __cxa_guard_acquire(&ImportModuleFunctions(ExpressionContext&,SynBase*,ModuleContext&)
                                    ::token), iVar12 != 0)) {
    ImportModuleFunctions::token = NULLC::TraceGetToken("analyze","ImportModuleFunctions");
    __cxa_guard_release(&ImportModuleFunctions(ExpressionContext&,SynBase*,ModuleContext&)::token);
    moduleCtx = local_140;
  }
  NULLC::TraceScope::TraceScope(&traceScope,ImportModuleFunctions::token);
  pBVar35 = moduleCtx->data->bytecode;
  local_150 = FindSymbols(pBVar35);
  local_120 = FindFirstVar(pBVar35);
  local_148 = &moduleCtx->data;
  uVar4 = pBVar35->variableCount;
  (*local_148)->importedFunctionCount = pBVar35->moduleFunctionCount;
  pEVar15 = FindFirstFunc(pBVar35);
  local_128 = FindFirstLocal(pBVar35);
  local_120 = local_120 + uVar4;
  local_100 = &ctx->functions;
  uVar4 = (ctx->functions).count;
  defaultAssignName.begin = "default_assign$_";
  defaultAssignName.end = "";
  uVar33 = 0;
  local_118 = pEVar15;
  local_108 = pBVar35;
  do {
    uVar27 = local_108->functionCount;
    uVar14 = local_108->moduleFunctionCount;
    if (uVar27 - uVar14 <= uVar33) {
      pBVar35 = local_108;
      for (uVar33 = 0; uVar33 < uVar27 - uVar14; uVar33 = uVar33 + 1) {
        ppFVar24 = SmallArray<FunctionData_*,_128U>::operator[](local_100,uVar4 + (int)uVar33);
        pFVar21 = *ppFVar24;
        for (uVar27 = 0; uVar27 < pEVar15[uVar33].paramCount; uVar27 = uVar27 + 1) {
          if (local_128[pEVar15[uVar33].offsetToFirstLocal + uVar27].defaultFuncId != 0xffff) {
            ppFVar24 = SmallArray<FunctionData_*,_128U>::operator[]
                                 (local_100,
                                  (local_128[pEVar15[uVar33].offsetToFirstLocal + uVar27].
                                   defaultFuncId + uVar4) - pBVar35->moduleFunctionCount);
            function = *ppFVar24;
            iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pTVar26 = function->type;
            iVar13 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
            pEVar25 = (ExprBase *)CONCAT44(extraout_var_13,iVar13);
            pTVar17 = function->contextType;
            pEVar25->typeID = 9;
            pEVar25->source = source;
            pEVar25->type = pTVar17;
            pEVar25->next = (ExprBase *)0x0;
            pEVar25->listed = false;
            pEVar25->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e35c8;
            ExprFunctionAccess::ExprFunctionAccess
                      ((ExprFunctionAccess *)CONCAT44(extraout_var_12,iVar12),source,
                       &pTVar26->super_TypeBase,function,pEVar25);
            iVar13 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
            pEVar25 = (ExprBase *)CONCAT44(extraout_var_14,iVar13);
            pTVar17 = function->type->returnType;
            pEVar25->typeID = 0x29;
            pEVar25->source = source;
            pEVar25->type = pTVar17;
            pEVar25->next = (ExprBase *)0x0;
            pEVar25->listed = false;
            pEVar25->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3a98;
            pEVar25[1]._vptr_ExprBase = (_func_int **)CONCAT44(extraout_var_12,iVar12);
            *(undefined8 *)&pEVar25[1].typeID = 0;
            pEVar25[1].source = (SynBase *)0x0;
            pAVar23 = SmallArray<ArgumentData,_4U>::operator[](&pFVar21->arguments,uVar27);
            pAVar23->value = pEVar25;
            pBVar35 = local_108;
          }
        }
        uVar27 = pBVar35->functionCount;
        uVar14 = pBVar35->moduleFunctionCount;
        pEVar15 = local_118;
      }
      NULLC::TraceScope::~TraceScope(&traceScope);
      return;
    }
    pcVar28 = local_150 + pEVar15[uVar33].offsetToName;
    functionName.begin = pcVar28;
    sVar16 = strlen(pcVar28);
    functionName.end = pcVar28 + sVar16;
    local_110 = (TypeFunction *)
                GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar15[uVar33].funcType);
    pEVar34 = pEVar15 + uVar33;
    if (local_110 == (TypeFunction *)0x0) {
      anon_unknown.dwarf_ff84f::Stop
                (ctx,source,"ERROR: can\'t find function \'%s\' type in module %.*s",
                 local_150 + pEVar34->offsetToName,
                 (ulong)(uint)(*(int *)&((*local_148)->name).end - (int)((*local_148)->name).begin))
      ;
    }
    generics.head = (MatchData *)0x0;
    generics.tail = (MatchData *)0x0;
    puVar29 = &local_120->type;
    local_f8 = 0;
    for (uVar30 = 0; uVar27 = pEVar34->explicitTypeCount, uVar30 < uVar27; uVar30 = uVar30 + 1) {
      pcVar28 = local_150 + ((ExternVarInfo *)(puVar29 + -2))->offsetToName;
      sVar16 = strlen(pcVar28);
      iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      name_01.end = pcVar28 + sVar16;
      name_01.begin = pcVar28;
      SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var,iVar12),name_01);
      if (*puVar29 == 0xffffffff) {
        pTVar17 = ctx->typeGeneric;
      }
      else {
        pTVar17 = GetImportedModuleTypeAt(ctx,source,local_140,*puVar29);
      }
      if (pTVar17 == (TypeBase *)0x0) {
        pcVar28 = ((*local_148)->name).begin;
        anon_unknown.dwarf_ff84f::Stop
                  (ctx,source,
                   "ERROR: can\'t find function \'%s\' explicit type \'%d\' in module %.*s",
                   local_150 + pEVar34->offsetToName,uVar30 & 0xffffffff,
                   (ulong)(uint)(*(int *)&((*local_148)->name).end - (int)pcVar28),pcVar28);
      }
      bVar11 = pTVar17->isGeneric;
      iVar13 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      node = (MatchData *)CONCAT44(extraout_var_00,iVar13);
      local_f8 = CONCAT71((int7)((ulong)local_f8 >> 8),(byte)local_f8 | bVar11);
      node->name = (SynIdentifier *)CONCAT44(extraout_var,iVar12);
      node->type = pTVar17;
      node->next = (MatchData *)0x0;
      node->listed = false;
      IntrusiveList<MatchData>::push_back(&generics,node);
      puVar29 = puVar29 + 4;
    }
    prev = (FunctionData *)0x0;
    anon_unknown.dwarf_ff84f::LookupFunctionChainByName(&chain,ctx,pEVar34->nameHash);
    pEVar15 = local_118;
    moduleCtx = local_140;
    local_120 = local_120 + uVar27;
    lVar31 = 0;
    while (lVar10 = CONCAT71(chain.node.node._1_7_,(byte)chain.node.node), lVar10 != 0) {
      lVar32 = *(long *)(lVar10 + 0x10);
      if ((*(char *)(lVar32 + 0x148) == '\0') &&
         (plVar1 = (long *)(lVar32 + 0x28), lVar32 = lVar31, (TypeFunction *)*plVar1 == local_110))
      {
        bVar11 = true;
        for (uVar27 = 0; uVar27 < pEVar34->explicitTypeCount; uVar27 = uVar27 + 1) {
          IntrusiveList<MatchData>::operator[]
                    ((IntrusiveList<MatchData> *)(*(long *)(lVar10 + 0x10) + 0x48),uVar27);
          IntrusiveList<MatchData>::operator[](&generics,uVar27);
          bVar11 = false;
        }
        if (bVar11) {
          prev = *(FunctionData **)(lVar10 + 0x10);
          break;
        }
      }
      anon_unknown.dwarf_ff84f::FunctionLookupChain::next(&local_90,&chain);
      chain.scope = local_90.scope;
      chain.node.start = local_90.node.start;
      chain.node.node._0_1_ = (byte)local_90.node.node;
      lVar31 = lVar32;
      chain.node.node._1_7_ = (undefined7)((ulong)local_90.node.node >> 8);
    }
    if (prev == (FunctionData *)0x0) {
      uVar30 = 0;
      for (uVar27 = 0; local_134 = (undefined4)CONCAT71((int7)(uVar30 >> 8),1),
          uVar27 < (ctx->namespaces).count; uVar27 = uVar27 + 1) {
        ppNVar18 = SmallArray<NamespaceData_*,_128U>::operator[](&ctx->namespaces,uVar27);
        uVar30 = (ulong)(*ppNVar18)->fullNameHash;
        if ((*ppNVar18)->fullNameHash == pEVar34->namespaceHash) {
          ppNVar18 = SmallArray<NamespaceData_*,_128U>::operator[](&ctx->namespaces,uVar27);
          if (*ppNVar18 != (NamespaceData *)0x0) {
            ExpressionContext::PushScope(ctx,*ppNVar18);
            local_134 = 0;
          }
          break;
        }
      }
      if (pEVar34->parentType == 0xffffffff) {
        local_158 = (TypeBase *)0x0;
      }
      else {
        local_158 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar34->parentType);
        if (local_158 == (TypeBase *)0x0) {
          anon_unknown.dwarf_ff84f::Stop
                    (ctx,source,"ERROR: can\'t find function \'%s\' parent type in module %.*s",
                     local_150 + pEVar34->offsetToName,
                     (ulong)(uint)(*(int *)&((*local_148)->name).end -
                                  (int)((*local_148)->name).begin));
        }
      }
      if (pEVar34->contextType == 0xffffffff) {
        pTVar17 = local_158;
        if (local_158 == (TypeBase *)0x0) {
          pTVar17 = ctx->typeVoid;
        }
        pTVar19 = ExpressionContext::GetReferenceType(ctx,pTVar17);
      }
      else {
        pTVar19 = (TypeRef *)GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar34->contextType);
        if (pTVar19 == (TypeRef *)0x0) {
          anon_unknown.dwarf_ff84f::Stop
                    (ctx,source,"ERROR: can\'t find function \'%s\' context type in module %.*s",
                     local_150 + pEVar34->offsetToName,
                     (ulong)(uint)(*(int *)&((*local_148)->name).end -
                                  (int)((*local_148)->name).begin));
        }
      }
      uVar2 = pEVar34->funcCat;
      local_15a = pEVar34->isOperator;
      local_159 = functionName.end[-1];
      local_130 = pTVar19;
      if (local_158 != (TypeBase *)0x0) {
        ExpressionContext::PushScope(ctx,local_158);
      }
      ppMVar20 = local_148;
      local_15b = uVar2;
      if (pEVar34->definitionModule != 0) {
        ppMVar20 = SmallArray<ModuleData_*,_32U>::operator[]
                             (&moduleCtx->dependencies,pEVar34->definitionModule - 1);
      }
      pMVar5 = *ppMVar20;
      uVar27 = pMVar5->lexStreamSize;
      if (uVar27 <= pEVar34->definitionLocationStart) {
        __assert_fail("function.definitionLocationStart < importModule->lexStreamSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x32fe,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      if (uVar27 <= pEVar34->definitionLocationEnd) {
        __assert_fail("function.definitionLocationEnd < importModule->lexStreamSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x32ff,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      source_00 = source;
      if (pEVar34->definitionLocationEnd != 0 || pEVar34->definitionLocationStart != 0) {
        iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        source_00 = (SynBase *)CONCAT44(extraout_var_01,iVar12);
        SynImportLocation::SynImportLocation
                  ((SynImportLocation *)source_00,
                   pMVar5->lexStream + pEVar34->definitionLocationStart,
                   pMVar5->lexStream + pEVar34->definitionLocationEnd);
        uVar27 = pMVar5->lexStreamSize;
      }
      uVar14 = pEVar34->definitionLocationName;
      if (uVar27 <= uVar14) {
        __assert_fail("function.definitionLocationName < importModule->lexStreamSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x3303,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      pAVar6 = ctx->allocator;
      if ((ulong)uVar14 == 0) {
        iVar12 = (*pAVar6->_vptr_Allocator[2])(pAVar6,0x50);
        this = (SynIdentifier *)CONCAT44(extraout_var_03,iVar12);
        name_00.end = functionName.end;
        name_00.begin = functionName.begin;
        SynIdentifier::SynIdentifier(this,name_00);
      }
      else {
        pLVar7 = pMVar5->lexStream;
        iVar12 = (*pAVar6->_vptr_Allocator[2])(pAVar6,0x50);
        this = (SynIdentifier *)CONCAT44(extraout_var_02,iVar12);
        name.end = functionName.end;
        name.begin = functionName.begin;
        SynIdentifier::SynIdentifier(this,pLVar7 + uVar14,pLVar7 + uVar14,name);
      }
      iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
      pFVar21 = (FunctionData *)CONCAT44(extraout_var_04,iVar12);
      pTVar26 = local_110;
      if ((local_110->super_TypeBase).typeID != 0x15) {
        pTVar26 = (TypeFunction *)0x0;
      }
      uVar27 = ctx->uniqueFunctionId;
      ctx->uniqueFunctionId = uVar27 + 1;
      generics_00.tail._0_4_ = (int)generics.tail;
      generics_00.head = generics.head;
      generics_00.tail._4_4_ = (int)((ulong)generics.tail >> 0x20);
      FunctionData::FunctionData
                (pFVar21,ctx->allocator,source_00,ctx->scope,local_15b == '\x03',local_159 == '$',
                 local_15a != '\0',pTVar26,&local_130->super_TypeBase,this,generics_00,uVar27);
      pFVar21->importModule = pMVar5;
      pFVar21->isPrototype = SUB41((uint)pEVar34->regVmCodeSize >> 0x1f,0);
      if (lVar31 != 0) {
        *(FunctionData **)(lVar31 + 0x150) = pFVar21;
      }
      pFVar21->isGenericInstance = pEVar34->isGenericInstance != '\0';
      chain.node.start = (Node *)anon_var_dwarf_eaa16;
      chain.node.node._0_1_ = 0x3e;
      chain.node.node._1_7_ = 0x3184;
      data = pFVar21;
      bVar11 = InplaceStr::operator==(&pFVar21->name->name,(InplaceStr *)&chain);
      if (bVar11) {
LAB_001e3041:
        data->isInternal = true;
      }
      else {
        local_90.node.start = (Node *)0x31843f;
        local_90.node.node = (Node *)0x318445;
        bVar11 = InplaceStr::operator==(&data->name->name,(InplaceStr *)&local_90);
        if (bVar11) goto LAB_001e3041;
        local_60.begin = "__closeUpvalue";
        local_60.end = "";
        bVar11 = InplaceStr::operator==(&data->name->name,&local_60);
        if (bVar11) goto LAB_001e3041;
      }
      if (pEVar34->funcCat == '\x01') {
        data->isHidden = true;
      }
      data->attributes = pEVar34->attributes;
      ExpressionContext::AddFunction(ctx,data);
      ExpressionContext::PushScope(ctx,data);
      data->functionScope = ctx->scope;
      for (uVar27 = 0; moduleCtx_00 = local_140, uVar27 < pEVar34->paramCount; uVar27 = uVar27 + 1)
      {
        uVar14 = pEVar34->offsetToFirstLocal + uVar27;
        bVar3 = local_128[uVar14].paramFlags;
        if (local_128[uVar14].type == 0xffffffff) {
          pTVar17 = ctx->typeGeneric;
        }
        else {
          pTVar17 = GetImportedModuleTypeAt(ctx,source,local_140,local_128[uVar14].type);
        }
        if (pTVar17 == (TypeBase *)0x0) {
          pcVar28 = ((*local_148)->name).begin;
          anon_unknown.dwarf_ff84f::Stop
                    (ctx,source,"ERROR: can\'t find argument %d type for \'%s\' in module %.*s",
                     (ulong)(uVar27 + 1),local_150 + pEVar34->offsetToName,
                     (ulong)(uint)(*(int *)&((*local_148)->name).end - (int)pcVar28),pcVar28);
        }
        pcVar28 = local_150 + local_128[uVar14].offsetToName;
        sVar16 = strlen(pcVar28);
        iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        this_00 = (ScopeData *)CONCAT44(extraout_var_05,iVar12);
        name_02.end = pcVar28 + sVar16;
        name_02.begin = pcVar28;
        SynIdentifier::SynIdentifier((SynIdentifier *)this_00,name_02);
        chain.node.node._0_1_ = bVar3 & 1;
        chain.node.start = (Node *)source;
        chain.scope = this_00;
        SmallArray<ArgumentData,_4U>::push_back(&data->arguments,(ArgumentData *)&chain);
        offset = anon_unknown.dwarf_ff84f::AllocateArgumentInScope(ctx,source,0,pTVar17);
        iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        uVar14 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar14 + 1;
        VariableData::VariableData
                  ((VariableData *)CONCAT44(extraout_var_06,iVar12),ctx->allocator,source,ctx->scope
                   ,0,pTVar17,(SynIdentifier *)this_00,offset,uVar14);
        ExpressionContext::AddVariable(ctx,(VariableData *)CONCAT44(extraout_var_06,iVar12),true);
      }
      if (local_130 == (TypeRef *)0x0) {
        __assert_fail("contextType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x333c,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      if (local_158 == (TypeBase *)0x0) {
        uVar14 = anon_unknown.dwarf_ff84f::AllocateArgumentInScope
                           (ctx,source,0,&local_130->super_TypeBase);
        iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        name_04.end = "";
        name_04.begin = "$context";
        SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_09,iVar12),name_04);
        iVar13 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        uVar27 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar27 + 1;
        VariableData::VariableData
                  ((VariableData *)CONCAT44(extraout_var_10,iVar13),ctx->allocator,source,ctx->scope
                   ,0,&local_130->super_TypeBase,(SynIdentifier *)CONCAT44(extraout_var_09,iVar12),
                   uVar14,uVar27);
        ExpressionContext::AddVariable(ctx,(VariableData *)CONCAT44(extraout_var_10,iVar13),false);
      }
      else {
        pTVar19 = ExpressionContext::GetReferenceType(ctx,local_158);
        uVar14 = anon_unknown.dwarf_ff84f::AllocateArgumentInScope
                           (ctx,source,0,&pTVar19->super_TypeBase);
        iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        name_03.end = "";
        name_03.begin = "this";
        SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_07,iVar12),name_03);
        iVar13 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        uVar27 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar27 + 1;
        VariableData::VariableData
                  ((VariableData *)CONCAT44(extraout_var_08,iVar13),ctx->allocator,source,ctx->scope
                   ,0,&pTVar19->super_TypeBase,(SynIdentifier *)CONCAT44(extraout_var_07,iVar12),
                   uVar14,uVar27);
        ExpressionContext::AddVariable(ctx,(VariableData *)CONCAT44(extraout_var_08,iVar13),true);
        moduleCtx_00 = local_140;
        if ((local_158->typeID == 0x18) &&
           (pcVar28 = strstr((data->name->name).begin,"::"), pcVar28 != (char *)0x0)) {
          SmallArray<FunctionData_*,_4U>::push_back
                    ((SmallArray<FunctionData_*,_4U> *)&local_158[3].name,&data);
          chain.node.start = (Node *)(pcVar28 + 2);
          sVar16 = strlen((char *)chain.node.start);
          chain.node.node._0_1_ = (byte)(pcVar28 + sVar16 + 2);
          chain.node.node._1_7_ = (undefined7)((ulong)(pcVar28 + sVar16 + 2) >> 8);
          uVar27 = InplaceStr::hash((InplaceStr *)&chain);
          DirectChainedMap<FunctionData_*>::insert
                    ((DirectChainedMap<FunctionData_*> *)&local_158[3].arrayTypes,uVar27,data);
        }
      }
      data->argumentsSize = data->functionScope->dataSize;
      if (((pEVar34->funcType == 0) ||
          ((((byte)local_f8 | (local_110->super_TypeBase).isGeneric) & 1) != 0)) ||
         ((local_158 != (TypeBase *)0x0 && (local_158->isGeneric == true)))) {
        if (data->importModule->lexStreamSize <= pEVar34->genericOffsetStart) {
          __assert_fail("function.genericOffsetStart < data->importModule->lexStreamSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x3364,
                        "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)"
                       );
        }
        data->delayedDefinition = data->importModule->lexStream + pEVar34->genericOffsetStart;
        if (pEVar34->genericReturnType == 0xffffffff) {
          pTVar17 = ctx->typeAuto;
        }
        else {
          pTVar17 = GetImportedModuleTypeAt(ctx,source,moduleCtx_00,pEVar34->genericReturnType);
        }
        if (pTVar17 == (TypeBase *)0x0) {
          anon_unknown.dwarf_ff84f::Stop
                    (ctx,source,
                     "ERROR: can\'t find generic function \'%s\' return type in module %.*s",
                     local_150 + pEVar34->offsetToName,
                     (ulong)(uint)(*(int *)&((*local_148)->name).end -
                                  (int)((*local_148)->name).begin));
        }
        chain.node.start = (Node *)0x0;
        chain.node.node._0_1_ = 0;
        chain.node.node._1_7_ = 0;
        for (uVar27 = 0; uVar27 < pEVar34->paramCount; uVar27 = uVar27 + 1) {
          uVar14 = pEVar34->offsetToFirstLocal;
          iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
          node_00 = (TypeHandle *)CONCAT44(extraout_var_11,iVar12);
          if (local_128[uVar14 + uVar27].type == 0xffffffff) {
            pTVar22 = ctx->typeGeneric;
          }
          else {
            pTVar22 = GetImportedModuleTypeAt
                                (ctx,source,moduleCtx_00,local_128[uVar14 + uVar27].type);
          }
          node_00->type = pTVar22;
          node_00->next = (TypeHandle *)0x0;
          node_00->listed = false;
          IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)&chain,node_00);
        }
        arguments.tail._0_1_ = (byte)chain.node.node;
        arguments.head = (TypeHandle *)chain.node.start;
        arguments.tail._1_7_ = chain.node.node._1_7_;
        pTVar26 = ExpressionContext::GetFunctionType(ctx,source,pTVar17,arguments);
        data->type = pTVar26;
      }
      if (data->type == (TypeFunction *)0x0) {
        __assert_fail("data->type",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x337c,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
      if ((data->isPrototype != false) || (data->isHidden == true)) {
        ExpressionContext::HideFunction(ctx,data);
      }
      if (local_158 != (TypeBase *)0x0) {
        ExpressionContext::PopScope(ctx,SCOPE_TYPE);
      }
      if ((char)local_134 == '\0') {
        ExpressionContext::PopScope(ctx,SCOPE_NAMESPACE);
      }
      bVar11 = InplaceStr::operator==(&functionName,&defaultAssignName);
      moduleCtx = local_140;
      pEVar15 = local_118;
      if ((bVar11) && ((data->arguments).count == 2)) {
        pAVar23 = SmallArray<ArgumentData,_4U>::operator[](&data->arguments,1);
        pTVar17 = pAVar23->type;
        moduleCtx = local_140;
        pEVar15 = local_118;
        if ((pTVar17 != (TypeBase *)0x0) && (pTVar17->typeID == 0x18)) {
          *(FunctionData **)&pTVar17[3].typeID = data;
        }
      }
    }
    else {
      pcVar28 = (prev->name->name).begin;
      if ((*pcVar28 != '$') && (prev->isGenericInstance != true)) {
        pcVar8 = (prev->type->super_TypeBase).name.begin;
        pcVar9 = ((*local_148)->name).begin;
        anon_unknown.dwarf_ff84f::Stop
                  (ctx,source,
                   "ERROR: function %.*s (type %.*s) is already defined. While importing %.*s",
                   (ulong)(uint)(*(int *)&(prev->name->name).end - (int)pcVar28),pcVar28,
                   (ulong)(uint)(*(int *)&(prev->type->super_TypeBase).name.end - (int)pcVar8),
                   pcVar8,*(int *)&((*local_148)->name).end - (int)pcVar9,pcVar9);
      }
      SmallArray<FunctionData_*,_128U>::push_back(local_100,&prev);
    }
    uVar33 = uVar33 + 1;
  } while( true );
}

Assistant:

void ImportModuleFunctions(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleFunctions");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	ExternVarInfo *explicitTypeInfo = FindFirstVar(bCode) + bCode->variableCount;

	moduleCtx.data->importedFunctionCount = bCode->moduleFunctionCount;

	// Import functions
	ExternFuncInfo *functionList = FindFirstFunc(bCode);
	ExternLocalInfo *localList = FindFirstLocal(bCode);

	unsigned currCount = ctx.functions.size();

	InplaceStr defaultAssignName = InplaceStr("default_assign$_");

	for(unsigned i = 0; i < bCode->functionCount - bCode->moduleFunctionCount; i++)
	{
		ExternFuncInfo &function = functionList[i];

		InplaceStr functionName = InplaceStr(symbols + function.offsetToName);

		TypeBase *functionType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.funcType);

		if(!functionType)
			Stop(ctx, source, "ERROR: can't find function '%s' type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));

		// Import function explicit type list
		IntrusiveList<MatchData> generics;

		bool hasGenericExplicitType = false;

		for(unsigned k = 0; k < function.explicitTypeCount; k++)
		{
			InplaceStr name = InplaceStr(symbols + explicitTypeInfo[k].offsetToName);

			SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(name);

			TypeBase *type = explicitTypeInfo[k].type == ~0u ? ctx.typeGeneric : GetImportedModuleTypeAt(ctx, source, moduleCtx, explicitTypeInfo[k].type);

			if(!type)
				Stop(ctx, source, "ERROR: can't find function '%s' explicit type '%d' in module %.*s", symbols + function.offsetToName, k, FMT_ISTR(moduleCtx.data->name));

			if(type->isGeneric)
				hasGenericExplicitType = true;

			generics.push_back(new (ctx.get<MatchData>()) MatchData(nameIdentifier, type));
		}

		explicitTypeInfo += function.explicitTypeCount;

		FunctionData *prev = NULL;
		FunctionData *prototype = NULL;

		for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, function.nameHash); chain; chain = chain.next())
		{
			if(chain->isPrototype)
			{
				prototype = *chain;
				continue;
			}

			if(chain->type == functionType)
			{
				bool explicitTypeMatch = true;

				for(unsigned k = 0; k < function.explicitTypeCount; k++)
				{
					TypeBase *prevType = chain->generics[k]->type;
					TypeBase *type = generics[k]->type;

					if(&prevType != &type)
						explicitTypeMatch = false;
				}

				if(explicitTypeMatch)
				{
					prev = *chain;
					break;
				}
			}
		}

		if(prev)
		{
			if(*prev->name->name.begin == '$' || prev->isGenericInstance)
				ctx.functions.push_back(prev);
			else
				Stop(ctx, source, "ERROR: function %.*s (type %.*s) is already defined. While importing %.*s", FMT_ISTR(prev->name->name), FMT_ISTR(prev->type->name), FMT_ISTR(moduleCtx.data->name));

			continue;
		}

		NamespaceData *parentNamespace = NULL;

		for(unsigned k = 0; k < ctx.namespaces.size(); k++)
		{
			if(ctx.namespaces[k]->fullNameHash == function.namespaceHash)
			{
				parentNamespace = ctx.namespaces[k];
				break;
			}
		}

		if(parentNamespace)
			ctx.PushScope(parentNamespace);

		TypeBase *parentType = NULL;

		if(function.parentType != ~0u)
		{
			parentType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.parentType);

			if(!parentType)
				Stop(ctx, source, "ERROR: can't find function '%s' parent type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}

		TypeBase *contextType = NULL;

		if(function.contextType != ~0u)
		{
			contextType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.contextType);

			if(!contextType)
				Stop(ctx, source, "ERROR: can't find function '%s' context type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}

		if(!contextType)
			contextType = ctx.GetReferenceType(parentType ? parentType : ctx.typeVoid);

		bool coroutine = function.funcCat == ExternFuncInfo::COROUTINE;
		bool accessor = *(functionName.end - 1) == '$';
		bool isOperator = function.isOperator != 0;

		if(parentType)
			ctx.PushScope(parentType);

		ModuleData *importModule = moduleCtx.data;

		if(function.definitionModule != 0)
			importModule = moduleCtx.dependencies[function.definitionModule - 1];

		assert(function.definitionLocationStart < importModule->lexStreamSize);
		assert(function.definitionLocationEnd < importModule->lexStreamSize);

		SynBase *locationSource = function.definitionLocationStart != 0 || function.definitionLocationEnd != 0 ? new (ctx.get<SynImportLocation>()) SynImportLocation(function.definitionLocationStart + importModule->lexStream, function.definitionLocationEnd + importModule->lexStream) : source;

		assert(function.definitionLocationName < importModule->lexStreamSize);

		Lexeme *locationName = function.definitionLocationName + importModule->lexStream;

		SynIdentifier *identifier = function.definitionLocationName != 0 ? new (ctx.get<SynIdentifier>()) SynIdentifier(locationName, locationName, functionName) : new (ctx.get<SynIdentifier>()) SynIdentifier(functionName);

		FunctionData *data = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, locationSource, ctx.scope, coroutine, accessor, isOperator, getType<TypeFunction>(functionType), contextType, identifier, generics, ctx.uniqueFunctionId++);

		data->importModule = importModule;

		data->isPrototype = (function.regVmCodeSize & 0x80000000) != 0;

		assert(data->isPrototype == ((function.regVmCodeSize & 0x80000000) != 0));

		if(prototype)
			prototype->implementation = data;

		// TODO: find function proto
		data->isGenericInstance = !!function.isGenericInstance;

		if(data->name->name == InplaceStr("__newS") || data->name->name == InplaceStr("__newA") || data->name->name == InplaceStr("__closeUpvalue"))
			data->isInternal = true;

		if(function.funcCat == ExternFuncInfo::LOCAL)
			data->isHidden = true;

		data->attributes = function.attributes;

		ctx.AddFunction(data);

		ctx.PushScope(data);

		data->functionScope = ctx.scope;

		for(unsigned n = 0; n < function.paramCount; n++)
		{
			ExternLocalInfo &argument = localList[function.offsetToFirstLocal + n];

			bool isExplicit = (argument.paramFlags & ExternLocalInfo::IS_EXPLICIT) != 0;

			TypeBase *argType = argument.type == ~0u ? ctx.typeGeneric : GetImportedModuleTypeAt(ctx, source, moduleCtx, argument.type);

			if(!argType)
				Stop(ctx, source, "ERROR: can't find argument %d type for '%s' in module %.*s", n + 1, symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));

			InplaceStr argName = InplaceStr(symbols + argument.offsetToName);

			SynIdentifier *argNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(argName);

			data->arguments.push_back(ArgumentData(source, isExplicit, argNameIdentifier, argType, NULL));

			unsigned offset = AllocateArgumentInScope(ctx, source, 0, argType);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, argType, argNameIdentifier, offset, ctx.uniqueVariableId++);

			ctx.AddVariable(variable, true);
		}

		assert(contextType);

		if(parentType)
		{
			TypeBase *type = ctx.GetReferenceType(parentType);

			unsigned offset = AllocateArgumentInScope(ctx, source, 0, type);

			SynIdentifier *argNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("this"));

			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, type, argNameIdentifier, offset, ctx.uniqueVariableId++);

			ctx.AddVariable(variable, true);

			// Register type method
			if(TypeClass *typeClass = getType<TypeClass>(parentType))
			{
				if(const char *pos = strstr(data->name->name.begin, "::"))
				{
					typeClass->methods.push_back(data);
					typeClass->methodMap.insert(InplaceStr(pos + 2).hash(), data);
				}
			}
		}
		else if(contextType)
		{
			unsigned offset = AllocateArgumentInScope(ctx, source, 0, contextType);

			SynIdentifier *argNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$context"));

			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, contextType, argNameIdentifier, offset, ctx.uniqueVariableId++);

			ctx.AddVariable(variable, false);
		}

		data->argumentsSize = data->functionScope->dataSize;

		// TODO: explicit flag
		if(function.funcType == 0 || functionType->isGeneric || hasGenericExplicitType || (parentType && parentType->isGeneric))
		{
			assert(function.genericOffsetStart < data->importModule->lexStreamSize);

			data->delayedDefinition = function.genericOffsetStart + data->importModule->lexStream;

			TypeBase *returnType = ctx.typeAuto;

			if(function.genericReturnType != ~0u)
				returnType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.genericReturnType);

			if(!returnType)
				Stop(ctx, source, "ERROR: can't find generic function '%s' return type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));

			IntrusiveList<TypeHandle> argTypes;

			for(unsigned n = 0; n < function.paramCount; n++)
			{
				ExternLocalInfo &argument = localList[function.offsetToFirstLocal + n];

				argTypes.push_back(new (ctx.get<TypeHandle>()) TypeHandle(argument.type == ~0u ? ctx.typeGeneric : GetImportedModuleTypeAt(ctx, source, moduleCtx, argument.type)));
			}

			data->type = ctx.GetFunctionType(source, returnType, argTypes);
		}

		assert(data->type);

		ctx.PopScope(SCOPE_FUNCTION);

		if(data->isPrototype)
			ctx.HideFunction(data);
		else if(data->isHidden)
			ctx.HideFunction(data);

		if(parentType)
			ctx.PopScope(SCOPE_TYPE);

		if(parentNamespace)
			ctx.PopScope(SCOPE_NAMESPACE);

		if(functionName == defaultAssignName && data->arguments.size() == 2)
		{
			if(TypeClass *typeClass = getType<TypeClass>(data->arguments[1].type))
				typeClass->defaultAssign = data;
		}
	}

	for(unsigned i = 0; i < bCode->functionCount - bCode->moduleFunctionCount; i++)
	{
		ExternFuncInfo &function = functionList[i];

		FunctionData *data = ctx.functions[currCount + i];

		for(unsigned n = 0; n < function.paramCount; n++)
		{
			ExternLocalInfo &argument = localList[function.offsetToFirstLocal + n];

			if(argument.defaultFuncId != 0xffff)
			{
				FunctionData *target = ctx.functions[currCount + argument.defaultFuncId - bCode->moduleFunctionCount];

				ExprBase *access = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(source, target->type, target, new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, target->contextType));

				data->arguments[n].value = new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, target->type->returnType, access, IntrusiveList<ExprBase>());
			}
		}
	}
}